

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1d382d4::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test::TestBody
          (AV1FwdTxfm2d_RunFwdAccuracyCheck_Test *this)

{
  int iVar1;
  double *pdVar2;
  undefined8 *puVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int32_t *piVar8;
  ulong uVar9;
  int16_t *piVar10;
  SEARCH_METHODS *pSVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  double actual_max_error;
  ACMRandom rnd;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  internal local_70 [8];
  undefined8 *local_68;
  Random local_5c;
  ulong local_58;
  double local_50;
  double *local_48;
  AssertHelper local_40;
  double local_38;
  
  local_5c.state_ = 0xbaba;
  iVar7 = (this->super_AV1FwdTxfm2d).count_;
  if (iVar7 < 1) {
    dVar14 = 0.0;
  }
  else {
    local_48 = &(this->super_AV1FwdTxfm2d).max_error_;
    uVar6 = (ulong)(uint)(this->super_AV1FwdTxfm2d).txfm2d_size_;
    uVar9 = 0;
    dVar14 = 0.0;
    do {
      local_50 = dVar14;
      if ((int)uVar6 < 1) {
        piVar10 = (this->super_AV1FwdTxfm2d).input_;
        piVar8 = (this->super_AV1FwdTxfm2d).output_;
      }
      else {
        lVar12 = 0;
        do {
          uVar4 = testing::internal::Random::Generate(&local_5c,0x80000000);
          uVar5 = uVar4 >> 0xf & 0x3ff;
          piVar10 = (this->super_AV1FwdTxfm2d).input_;
          piVar10[lVar12] = (int16_t)uVar5;
          (this->super_AV1FwdTxfm2d).ref_input_[lVar12] = (double)uVar5;
          piVar8 = (this->super_AV1FwdTxfm2d).output_;
          piVar8[lVar12] = 0;
          (this->super_AV1FwdTxfm2d).ref_output_[lVar12] = 0.0;
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->super_AV1FwdTxfm2d).txfm2d_size_);
      }
      (*(this->super_AV1FwdTxfm2d).fwd_txfm_)
                (piVar10,piVar8,(this->super_AV1FwdTxfm2d).tx_width_,
                 (this->super_AV1FwdTxfm2d).tx_type_,10);
      iVar7 = (this->super_AV1FwdTxfm2d).ud_flip_;
      iVar1 = (this->super_AV1FwdTxfm2d).lr_flip_;
      local_58 = uVar9;
      if (iVar7 == 0 || iVar1 == 0) {
        if (iVar1 == 0) {
          if (iVar7 != 0) {
            iVar7 = (this->super_AV1FwdTxfm2d).tx_width_;
            libaom_test::flipud<double>
                      ((this->super_AV1FwdTxfm2d).ref_input_,iVar7,
                       (this->super_AV1FwdTxfm2d).tx_height_,iVar7);
          }
        }
        else {
          iVar7 = (this->super_AV1FwdTxfm2d).tx_width_;
          libaom_test::fliplr<double>
                    ((this->super_AV1FwdTxfm2d).ref_input_,iVar7,
                     (this->super_AV1FwdTxfm2d).tx_height_,iVar7);
        }
      }
      else {
        iVar7 = (this->super_AV1FwdTxfm2d).tx_width_;
        libaom_test::fliplrud<double>
                  ((this->super_AV1FwdTxfm2d).ref_input_,iVar7,(this->super_AV1FwdTxfm2d).tx_height_
                   ,iVar7);
      }
      libaom_test::reference_hybrid_2d
                ((this->super_AV1FwdTxfm2d).ref_input_,(this->super_AV1FwdTxfm2d).ref_output_,
                 (this->super_AV1FwdTxfm2d).tx_type_,(this->super_AV1FwdTxfm2d).tx_size_);
      local_78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      lVar12 = (long)(this->super_AV1FwdTxfm2d).txfm2d_size_;
      if (0 < lVar12) {
        piVar8 = (this->super_AV1FwdTxfm2d).output_;
        pdVar2 = (this->super_AV1FwdTxfm2d).ref_output_;
        lVar13 = 0;
        do {
          dVar14 = ::round(pdVar2[lVar13]);
          pdVar2[lVar13] = dVar14;
          pbVar15 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ABS((double)piVar8[lVar13] - dVar14) /
                    (this->super_AV1FwdTxfm2d).amplify_factor_);
          if ((double)local_78._M_head_impl <= (double)pbVar15) {
            local_78._M_head_impl = pbVar15;
          }
          lVar13 = lVar13 + 1;
        } while (lVar12 != lVar13);
      }
      pdVar2 = local_48;
      testing::internal::CmpHelperGE<double,double>
                (local_70,"max_error_","actual_max_error",local_48,(double *)&local_78);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) + 0x10),
                   "tx_w: ",6);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) + 0x10),
                   (this->super_AV1FwdTxfm2d).tx_width_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) + 0x10),
                   " tx_h: ",7);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) + 0x10),
                   (this->super_AV1FwdTxfm2d).tx_height_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) + 0x10),
                   ", tx_type = ",0xc);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) + 0x10),
                   (uint)(this->super_AV1FwdTxfm2d).tx_type_);
        pSVar11 = "";
        if (local_68 != (undefined8 *)0x0) {
          pSVar11 = (SEARCH_METHODS *)*local_68;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                   ,0x66,(char *)pSVar11);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((long *)CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_80.data_._1_7_,(TX_TYPE)local_80.data_) + 8))();
        }
      }
      puVar3 = local_68;
      if (local_68 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_68 != local_68 + 2) {
          operator_delete((undefined8 *)*local_68);
        }
        operator_delete(puVar3);
      }
      if (*pdVar2 <= (double)local_78._M_head_impl && (double)local_78._M_head_impl != *pdVar2) {
        iVar7 = (this->super_AV1FwdTxfm2d).count_;
        dVar14 = local_50;
        break;
      }
      iVar7 = (this->super_AV1FwdTxfm2d).txfm2d_size_;
      uVar6 = (ulong)iVar7;
      if ((long)uVar6 < 1) {
        dVar14 = 0.0;
      }
      else {
        dVar14 = 0.0;
        uVar9 = 0;
        do {
          dVar14 = dVar14 + ABS((double)(this->super_AV1FwdTxfm2d).output_[uVar9] -
                                (this->super_AV1FwdTxfm2d).ref_output_[uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      dVar14 = local_50 + dVar14 / (double)iVar7;
      uVar5 = (int)local_58 + 1;
      uVar9 = (ulong)uVar5;
      iVar7 = (this->super_AV1FwdTxfm2d).count_;
    } while ((int)uVar5 < iVar7);
  }
  local_38 = (dVar14 / (this->super_AV1FwdTxfm2d).amplify_factor_) / (double)iVar7;
  testing::internal::CmpHelperGE<double,double>
            (local_70,"max_avg_error_","avg_abs_error",&(this->super_AV1FwdTxfm2d).max_avg_error_,
             &local_38);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),"tx_size = ",10);
    local_80.data_._0_1_ = (this->super_AV1FwdTxfm2d).tx_size_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),(char *)&local_80,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),", tx_type = ",0xc);
    local_80.data_._0_1_ = (this->super_AV1FwdTxfm2d).tx_type_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),(char *)&local_80,1);
    if (local_68 == (undefined8 *)0x0) {
      pSVar11 = "";
    }
    else {
      pSVar11 = (SEARCH_METHODS *)*local_68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
               ,0x73,(char *)pSVar11);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_68 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_68 != local_68 + 2) {
      operator_delete((undefined8 *)*local_68);
    }
    operator_delete(local_68);
  }
  return;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }